

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_psk_derive_premaster(mbedtls_ssl_context *ssl,mbedtls_key_exchange_type_t key_ex)

{
  mbedtls_ssl_config *pmVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  size_t __n;
  ushort uVar3;
  int iVar4;
  size_t in_RAX;
  int line;
  size_t *psVar5;
  char *pcVar6;
  mbedtls_mpi *X;
  uchar *puVar7;
  uchar *__src;
  size_t zlen;
  size_t local_38;
  
  pmVar1 = ssl->conf;
  pmVar2 = ssl->handshake;
  __src = pmVar2->psk;
  if (__src == (uchar *)0x0) {
    psVar5 = &pmVar1->psk_len;
    __src = pmVar1->psk;
  }
  else {
    psVar5 = &pmVar2->psk_len;
  }
  if (3 < key_ex - MBEDTLS_KEY_EXCHANGE_PSK) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x48d,"should never happen");
    return -0x6c00;
  }
  __n = *psVar5;
  uVar3 = (ushort)__n;
  local_38 = in_RAX;
  switch(key_ex) {
  case MBEDTLS_KEY_EXCHANGE_PSK:
    if (0x42400000000 < (long)((__n << 0x20) + 0x200000000)) {
      return -0x7100;
    }
    *(ushort *)pmVar2->premaster = uVar3 << 8 | uVar3 >> 8;
    puVar7 = pmVar2->premaster + __n + 2;
    goto LAB_001642fc;
  case MBEDTLS_KEY_EXCHANGE_DHE_PSK:
    iVar4 = mbedtls_dhm_calc_secret
                      (&pmVar2->dhm_ctx,pmVar2->premaster + 2,0x422,&local_38,pmVar1->f_rng,
                       pmVar1->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_dhm_calc_secret";
      line = 0x46b;
LAB_0016424c:
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,line,pcVar6,iVar4);
      return iVar4;
    }
    puVar7 = pmVar2->premaster + 2 + local_38;
    *(ushort *)pmVar2->premaster = (ushort)local_38 << 8 | (ushort)local_38 >> 8;
    X = &(ssl->handshake->dhm_ctx).K;
    pcVar6 = "DHM: K ";
    iVar4 = 0x472;
    break;
  case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
    pmVar2->premaster[0] = '\0';
    pmVar2->premaster[1] = '0';
    puVar7 = pmVar2->premaster + 0x32;
    goto LAB_001642fc;
  case MBEDTLS_KEY_EXCHANGE_ECDHE_PSK:
    iVar4 = mbedtls_ecdh_calc_secret
                      (&pmVar2->ecdh_ctx,&local_38,pmVar2->premaster + 2,0x422,pmVar1->f_rng,
                       pmVar1->p_rng);
    if (iVar4 != 0) {
      pcVar6 = "mbedtls_ecdh_calc_secret";
      line = 0x480;
      goto LAB_0016424c;
    }
    puVar7 = pmVar2->premaster + 2 + local_38;
    *(ushort *)pmVar2->premaster = (ushort)local_38 << 8 | (ushort)local_38 >> 8;
    X = &(ssl->handshake->ecdh_ctx).z;
    pcVar6 = "ECDH: z";
    iVar4 = 0x488;
  }
  mbedtls_debug_print_mpi
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,iVar4,pcVar6,X);
LAB_001642fc:
  iVar4 = -0x7100;
  if ((long)((int)__n + 2) <= (long)pmVar2 + (0xa84 - (long)puVar7)) {
    *(ushort *)puVar7 = uVar3 << 8 | uVar3 >> 8;
    memcpy(puVar7 + 2,__src,__n);
    ssl->handshake->pmslen = (size_t)(puVar7 + (__n - (long)ssl->handshake) + -0x65e);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_psk_derive_premaster( mbedtls_ssl_context *ssl, mbedtls_key_exchange_type_t key_ex )
{
    unsigned char *p = ssl->handshake->premaster;
    unsigned char *end = p + sizeof( ssl->handshake->premaster );
    const unsigned char *psk = ssl->conf->psk;
    size_t psk_len = ssl->conf->psk_len;

    /* If the psk callback was called, use its result */
    if( ssl->handshake->psk != NULL )
    {
        psk = ssl->handshake->psk;
        psk_len = ssl->handshake->psk_len;
    }

    /*
     * PMS = struct {
     *     opaque other_secret<0..2^16-1>;
     *     opaque psk<0..2^16-1>;
     * };
     * with "other_secret" depending on the particular key exchange
     */
#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_PSK )
    {
        if( end - p < 2 + (int) psk_len )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        *(p++) = (unsigned char)( psk_len >> 8 );
        *(p++) = (unsigned char)( psk_len      );
        p += psk_len;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        /*
         * other_secret already set by the ClientKeyExchange message,
         * and is 48 bytes long
         */
        *p++ = 0;
        *p++ = 48;
        p += 48;
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        int ret;
        size_t len;

        /* Write length only when we know the actual value */
        if( ( ret = mbedtls_dhm_calc_secret( &ssl->handshake->dhm_ctx,
                                      p + 2, end - ( p + 2 ), &len,
                                      ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_dhm_calc_secret", ret );
            return( ret );
        }
        *(p++) = (unsigned char)( len >> 8 );
        *(p++) = (unsigned char)( len );
        p += len;

        MBEDTLS_SSL_DEBUG_MPI( 3, "DHM: K ", &ssl->handshake->dhm_ctx.K  );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED)
    if( key_ex == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        int ret;
        size_t zlen;

        if( ( ret = mbedtls_ecdh_calc_secret( &ssl->handshake->ecdh_ctx, &zlen,
                                       p + 2, end - ( p + 2 ),
                                       ssl->conf->f_rng, ssl->conf->p_rng ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ecdh_calc_secret", ret );
            return( ret );
        }

        *(p++) = (unsigned char)( zlen >> 8 );
        *(p++) = (unsigned char)( zlen      );
        p += zlen;

        MBEDTLS_SSL_DEBUG_MPI( 3, "ECDH: z", &ssl->handshake->ecdh_ctx.z );
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /* opaque psk<0..2^16-1>; */
    if( end - p < 2 + (int) psk_len )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    *(p++) = (unsigned char)( psk_len >> 8 );
    *(p++) = (unsigned char)( psk_len      );
    memcpy( p, psk, psk_len );
    p += psk_len;

    ssl->handshake->pmslen = p - ssl->handshake->premaster;

    return( 0 );
}